

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

int exr_set_display_window(exr_context_t ctxt,int part_index,exr_attr_box2i_t *dw)

{
  long lVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 *in_RDX;
  int in_ESI;
  char *in_RDI;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  exr_priv_part_t part;
  exr_context_t in_stack_00000018;
  exr_result_t rv;
  exr_attribute_t *attr;
  undefined4 in_stack_00000030;
  exr_const_context_t in_stack_ffffffffffffffc0;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDX == (undefined8 *)0x0) {
    local_2c = (**(code **)(in_RDI + 0x40))(in_RDI,3,"Missing value for data window assignment");
  }
  else {
    local_2c = 0;
    if (in_RDI == (char *)0x0) {
      local_2c = 2;
    }
    else {
      internal_exr_lock(in_stack_ffffffffffffffc0);
      if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
        local_2c = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
      }
      else {
        lVar1 = *(long *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
        if (*in_RDI == '\0') {
          internal_exr_unlock(in_stack_ffffffffffffffc0);
          local_2c = (**(code **)(in_RDI + 0x38))(in_RDI,8);
        }
        else if (*in_RDI == '\x03') {
          internal_exr_unlock(in_stack_ffffffffffffffc0);
          local_2c = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
        }
        else {
          if (*(long *)(lVar1 + 0x38) == 0) {
            local_2c = exr_attr_list_add(in_stack_00000018,(exr_attribute_list_t *)part,
                                         in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                                         (uint8_t **)
                                         CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),
                                         (exr_attribute_t **)CONCAT44(part_index,in_stack_00000030))
            ;
          }
          else if (*(int *)(*(long *)(lVar1 + 0x38) + 0x14) != 1) {
            internal_exr_unlock(in_stack_ffffffffffffffc0);
            iVar3 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               *(undefined8 *)(*(long *)(lVar1 + 0x38) + 8),"displayWindow");
            return iVar3;
          }
          if (local_2c == 0) {
            puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0x38) + 0x18);
            *puVar2 = *in_RDX;
            puVar2[1] = in_RDX[1];
            *(undefined8 *)(lVar1 + 0xa0) = *in_RDX;
            *(undefined8 *)(lVar1 + 0xa8) = in_RDX[1];
          }
          internal_exr_unlock(in_stack_ffffffffffffffc0);
        }
      }
    }
  }
  return local_2c;
}

Assistant:

exr_result_t
exr_set_display_window (
    exr_context_t ctxt, int part_index, const exr_attr_box2i_t* dw)
{
    if (!dw)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment");

    {
        REQ_ATTR_FIND_CREATE (displayWindow, EXR_ATTR_BOX2I);
        if (rv == EXR_ERR_SUCCESS)
        {
            *(attr->box2i)       = *dw;
            part->display_window = *dw;
        }

        return EXR_UNLOCK_AND_RETURN (rv);
    }
}